

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O0

void reap_worker(void *unused)

{
  size_t sVar1;
  nni_cb p_Var2;
  bool bVar3;
  void *pvVar4;
  void *ptr;
  nni_cb func;
  size_t offset;
  nni_reap_node *node;
  nni_reap_list *pnStack_18;
  _Bool reaped;
  nni_reap_list *list;
  void *unused_local;
  
  nni_thr_set_name((nni_thr *)0x0,"nng:reap2");
  nni_mtx_lock(&reap_mtx);
  while( true ) {
    do {
      bVar3 = false;
      for (pnStack_18 = reap_list; pnStack_18 != (nni_reap_list *)0x0;
          pnStack_18 = pnStack_18->rl_next) {
        offset = (size_t)pnStack_18->rl_nodes;
        if ((nni_reap_node *)offset != (nni_reap_node *)0x0) {
          bVar3 = true;
          sVar1 = pnStack_18->rl_offset;
          p_Var2 = pnStack_18->rl_func;
          pnStack_18->rl_nodes = (nni_reap_node *)0x0;
          nni_mtx_unlock(&reap_mtx);
          while (offset != 0) {
            pvVar4 = (void *)(offset - sVar1);
            offset = *(size_t *)offset;
            (*p_Var2)(pvVar4);
          }
          nni_mtx_lock(&reap_mtx);
        }
      }
    } while (bVar3);
    reap_empty = true;
    nni_cv_wake(&reap_empty_cv);
    if ((reap_exit & 1U) != 0) break;
    nni_cv_wait(&reap_work_cv);
  }
  nni_mtx_unlock(&reap_mtx);
  return;
}

Assistant:

static void
reap_worker(void *unused)
{
	NNI_ARG_UNUSED(unused);
	nni_thr_set_name(NULL, "nng:reap2");

	nni_mtx_lock(&reap_mtx);
	for (;;) {
		nni_reap_list *list;
		bool           reaped = false;

		for (list = reap_list; list != NULL; list = list->rl_next) {
			nni_reap_node *node;
			size_t         offset;
			nni_cb         func;

			if ((node = list->rl_nodes) == NULL) {
				continue;
			}

			reaped         = true;
			offset         = list->rl_offset;
			func           = list->rl_func;
			list->rl_nodes = NULL;

			// We process our list of nodes while not holding
			// the lock.
			nni_mtx_unlock(&reap_mtx);
			while (node != NULL) {
				void *ptr;
				ptr  = ((char *) node) - offset;
				node = node->rn_next;
				func(ptr);
			}
			nni_mtx_lock(&reap_mtx);
		}
		if (!reaped) {
			reap_empty = true;
			nni_cv_wake(&reap_empty_cv);
			if (reap_exit) {
				nni_mtx_unlock(&reap_mtx);
				return;
			}
			nni_cv_wait(&reap_work_cv);
		}
	}
}